

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pytypes.h
# Opt level: O0

str __thiscall
pybind11::str::format<float_const&,float_const&,float_const&>
          (str *this,float *args,float *args_1,float *args_2)

{
  object in_RDI;
  object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>_> *in_R8;
  char *in_stack_ffffffffffffffa0;
  object_api<pybind11::handle> *in_stack_ffffffffffffffa8;
  float *in_stack_ffffffffffffffc0;
  object *in_stack_ffffffffffffffc8;
  str *in_stack_ffffffffffffffd0;
  
  detail::object_api<pybind11::handle>::attr(in_stack_ffffffffffffffa8,in_stack_ffffffffffffffa0);
  detail::object_api<pybind11::detail::accessor<pybind11::detail::accessor_policies::str_attr>>::
  operator()(in_R8,(float *)in_stack_ffffffffffffffd0,(float *)in_stack_ffffffffffffffc8,
             in_stack_ffffffffffffffc0);
  str(in_stack_ffffffffffffffd0,in_stack_ffffffffffffffc8);
  object::~object((object *)0x1a9bbe);
  detail::accessor<pybind11::detail::accessor_policies::str_attr>::~accessor
            ((accessor<pybind11::detail::accessor_policies::str_attr> *)0x1a9bc8);
  return (str)in_RDI.super_handle.m_ptr;
}

Assistant:

str format(Args &&...args) const {
        return attr("format")(std::forward<Args>(args)...);
    }